

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

float PsiER(float *ve,float *va)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  float local_40;
  float local_3c;
  float VA [3];
  float VE [3];
  float r;
  float v;
  float nve;
  float nva;
  float *va_local;
  float *ve_local;
  
  VA[1] = *ve;
  VA[2] = ve[1];
  local_40 = *va;
  local_3c = va[1];
  VA[0] = 1.0;
  fVar1 = norm(&local_40,3);
  fVar2 = norm(VA + 1,3);
  VE[2] = (VA[1] * local_40 + VA[2] * local_3c + 1.0) / (fVar1 * fVar2);
  if ((1.0 < VE[2]) && (VE[2] < 1.0001)) {
    VE[2] = 1.0;
  }
  dVar4 = acos((double)VE[2]);
  fVar3 = (float)((dVar4 * 180.0) / 3.141592653589793);
  if ((fVar3 < 0.0) || (180.0 <= fVar3)) {
    printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",(double)fVar3,
           (double)VE[2],(double)fVar1,(double)fVar2);
    printf("va=(%f,%f) ve=(%f,%f)\n",(double)*va,(double)va[1],(double)*ve,(double)ve[1]);
  }
  return fVar3;
}

Assistant:

float PsiER(float ve[], float va[])
{
float nva;
float nve;
float v,r;
float VE[3],VA[3];

VE[0] = ve[0];
VE[1] = ve[1];
VE[2] = 1.0;

VA[0] = va[0];
VA[1] = va[1];
VA[2] = 1.0;

nva = norm(VA,3);
nve = norm(VE,3);
v =  (VE[0]*VA[0]+VE[1]*VA[1]+1.0f)/(nva*nve);

/**  sometimes roundoff error causes problems **/
if(v>1.0 && v < 1.0001) v = 1.0;

r = (float) (acos(v)*180.0/HALF_C);

if (!(r>=0.0 && r< 180.0))
{
printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",r,v,nva,nve);
printf("va=(%f,%f) ve=(%f,%f)\n",va[0],va[1],ve[0],ve[1]);
}

return r;
}